

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Object::~Object(Object *this)

{
  bool bVar1;
  Object *this_local;
  
  this->_vptr_Object = (_func_int **)&PTR__Object_0043e620;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->finalizer_);
  if (bVar1) {
    std::function<void_(wabt::interp::Object_*)>::operator()(&this->finalizer_,this);
  }
  std::function<void_(wabt::interp::Object_*)>::~function(&this->finalizer_);
  return;
}

Assistant:

Object::~Object() {
  if (finalizer_) {
    finalizer_(this);
  }
}